

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector_dce.cpp
# Opt level: O1

void __thiscall
spvtools::opt::VectorDCE::MarkUsesAsLive
          (VectorDCE *this,Instruction *current_inst,BitVector *live_elements,
          LiveComponentMap *live_components,
          vector<spvtools::opt::VectorDCE::WorkListItem,_std::allocator<spvtools::opt::VectorDCE::WorkListItem>_>
          *work_list)

{
  IRContext *this_00;
  DefUseManager *pDVar1;
  pointer pOVar2;
  uint **ppuVar3;
  bool bVar4;
  char cVar5;
  uint **ppuVar6;
  pointer pOVar7;
  long **local_88;
  undefined8 uStack_80;
  code *local_78;
  code *pcStack_70;
  vector<spvtools::opt::VectorDCE::WorkListItem,_std::allocator<spvtools::opt::VectorDCE::WorkListItem>_>
  *local_68;
  uint *local_60;
  long *local_58;
  undefined8 uStack_50;
  code *local_48;
  code *pcStack_40;
  
  this_00 = (this->super_MemPass).super_Pass.context_;
  local_68 = work_list;
  if ((this_00->valid_analyses_ & kAnalysisBegin) == kAnalysisNone) {
    IRContext::BuildDefUseManager(this_00);
  }
  pDVar1 = (this_00->def_use_mgr_)._M_t.
           super___uniq_ptr_impl<spvtools::opt::analysis::DefUseManager,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
           ._M_t.
           super__Tuple_impl<0UL,_spvtools::opt::analysis::DefUseManager_*,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
           .super__Head_base<0UL,_spvtools::opt::analysis::DefUseManager_*,_false>._M_head_impl;
  local_48 = (code *)0x0;
  pcStack_40 = (code *)0x0;
  local_58 = (long *)0x0;
  uStack_50 = 0;
  local_58 = (long *)operator_new(0x28);
  *local_58 = (long)&local_68;
  local_58[1] = (long)live_elements;
  local_58[2] = (long)this;
  local_58[3] = (long)live_components;
  local_58[4] = (long)pDVar1;
  pcStack_40 = std::
               _Function_handler<void_(unsigned_int_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/vector_dce.cpp:246:29)>
               ::_M_invoke;
  local_48 = std::
             _Function_handler<void_(unsigned_int_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/vector_dce.cpp:246:29)>
             ::_M_manager;
  uStack_80 = 0;
  pcStack_70 = std::
               _Function_handler<bool_(unsigned_int_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/instruction.h:830:17)>
               ::_M_invoke;
  local_78 = std::
             _Function_handler<bool_(unsigned_int_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/instruction.h:830:17)>
             ::_M_manager;
  pOVar7 = (current_inst->operands_).
           super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>.
           _M_impl.super__Vector_impl_data._M_start;
  pOVar2 = (current_inst->operands_).
           super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  local_88 = &local_58;
  if (pOVar7 != pOVar2) {
    do {
      bVar4 = spvIsInIdType(pOVar7->type);
      if (bVar4) {
        ppuVar3 = (uint **)(pOVar7->words).large_data_._M_t.
                           super___uniq_ptr_impl<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                           .
                           super__Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false>
                           ._M_head_impl;
        ppuVar6 = &(pOVar7->words).small_data_;
        if (ppuVar3 != (uint **)0x0) {
          ppuVar6 = ppuVar3;
        }
        local_60 = *ppuVar6;
        if (local_78 == (code *)0x0) {
          std::__throw_bad_function_call();
        }
        cVar5 = (*pcStack_70)(&local_88,&local_60);
        if (cVar5 == '\0') break;
      }
      pOVar7 = pOVar7 + 1;
    } while (pOVar7 != pOVar2);
  }
  if (local_78 != (code *)0x0) {
    (*local_78)(&local_88,&local_88,3);
  }
  if (local_48 != (code *)0x0) {
    (*local_48)(&local_58,&local_58,3);
  }
  return;
}

Assistant:

void VectorDCE::MarkUsesAsLive(
    Instruction* current_inst, const utils::BitVector& live_elements,
    LiveComponentMap* live_components,
    std::vector<VectorDCE::WorkListItem>* work_list) {
  analysis::DefUseManager* def_use_mgr = context()->get_def_use_mgr();

  current_inst->ForEachInId([&work_list, &live_elements, this, live_components,
                             def_use_mgr](uint32_t* operand_id) {
    Instruction* operand_inst = def_use_mgr->GetDef(*operand_id);

    if (HasVectorResult(operand_inst)) {
      WorkListItem new_item;
      new_item.instruction = operand_inst;
      new_item.components = live_elements;
      AddItemToWorkListIfNeeded(new_item, live_components, work_list);
    } else if (HasScalarResult(operand_inst)) {
      WorkListItem new_item;
      new_item.instruction = operand_inst;
      new_item.components.Set(0);
      AddItemToWorkListIfNeeded(new_item, live_components, work_list);
    }
  });
}